

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,StringPiece *value)

{
  LogMessage *in_RDI;
  string local_30 [24];
  StringPiece *in_stack_ffffffffffffffe8;
  
  StringPiece::ToString_abi_cxx11_(in_stack_ffffffffffffffe8);
  std::__cxx11::string::operator+=((string *)&in_RDI->message_,local_30);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

LogMessage& LogMessage::operator<<(const StringPiece& value) {
  message_ += value.ToString();
  return *this;
}